

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O0

Am_Wrapper * pass_window_proc(Am_Object *self)

{
  bool bVar1;
  bool bVar2;
  Am_Value *this;
  bool local_63;
  bool local_61;
  Am_Object local_48;
  byte local_39;
  Am_Object local_38 [3];
  Am_Object local_20;
  Am_Object owner;
  Am_Object *self_local;
  
  owner.data = (Am_Object_Data *)self;
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)self);
  local_39 = 0;
  bVar2 = false;
  bVar1 = Am_Object::Valid(&local_20);
  local_61 = false;
  if (bVar1) {
    Am_Object::Am_Object(local_38,&Am_Graphical_Object);
    local_39 = 1;
    bVar2 = Am_Object::Is_Instance_Of(&local_20,local_38);
    local_63 = true;
    bVar2 = !bVar2;
    if (bVar2) {
      Am_Object::Am_Object(&local_48,&Am_Window);
      local_63 = Am_Object::Is_Instance_Of(&local_20,&local_48);
    }
    local_61 = local_63;
  }
  if (bVar2) {
    Am_Object::~Am_Object(&local_48);
  }
  if ((local_39 & 1) != 0) {
    Am_Object::~Am_Object(local_38);
  }
  if (local_61 == false) {
    self_local = (Am_Object *)0x0;
  }
  else {
    this = Am_Object::Get(&local_20,0x68,0);
    self_local = (Am_Object *)Am_Value::operator_cast_to_Am_Wrapper_(this);
  }
  Am_Object::~Am_Object(&local_20);
  return (Am_Wrapper *)self_local;
}

Assistant:

Am_Define_Object_Formula(pass_window)
{
  Am_Object owner = self.Get_Owner();
  if (owner.Valid() && (owner.Is_Instance_Of(Am_Graphical_Object) ||
                        owner.Is_Instance_Of(Am_Window)))
    return owner.Get(Am_WINDOW);
  else
    return nullptr;
}